

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

int mpt_bind(mpt_socket *sd,char *where,mpt_fdmode *mode,int backlog)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  mpt_fdmode mVar7;
  ulong uVar8;
  socklen_t len;
  mpt_fdmode info;
  socklen_t local_9c;
  undefined1 local_98 [2];
  anon_union_4_2_317a4d69_for_param aStack_96;
  uint16_t uStack_92;
  
  if (where == (char *)0x0) {
    iVar3 = sd->_id;
    if (iVar3 < 0) {
      return 0;
    }
    local_9c = 0x6e;
    iVar4 = getsockname(iVar3,(sockaddr *)local_98,&local_9c);
    if (((-1 < iVar4) && (local_98 == (undefined1  [2])0x1)) && (2 < local_9c)) {
      unlink(local_98 + 2);
    }
    close(iVar3);
    sd->_id = -1;
    return 1;
  }
  if (mode == (mpt_fdmode *)0x0) {
    uVar5 = mpt_mode_parse(local_98,where);
    mVar7 = _local_98;
    if ((int)uVar5 < 0) goto LAB_00103a94;
    if (uVar5 != 0) {
      mVar7 = (mpt_fdmode)((ulong)_local_98 & 0xff);
      uVar8 = (ulong)uVar5;
      goto LAB_001039ad;
    }
    local_98 = (undefined1  [2])(local_98 & 0xff00);
    uStack_92 = mVar7.stream;
    aStack_96 = (anon_union_4_2_317a4d69_for_param)0x1;
    uVar8 = 0;
  }
  else {
    mVar7 = *mode;
    uVar8 = 0;
    _local_98 = mVar7;
LAB_001039ad:
    if (mVar7.family < '\0') {
      if (((ulong)_local_98 & 0x10000) != 0) {
LAB_00103a94:
        piVar6 = __errno_location();
        *piVar6 = 0x16;
        return -1;
      }
      if (((ulong)_local_98 & 0x400000) == 0) {
LAB_00103a8f:
        bVar1 = false;
        uVar2 = aStack_96.file.open;
      }
      else {
        iVar3 = mkfifo(where,(uint)aStack_96.file.perm);
        if (iVar3 < 0) {
          if (local_98[2] < '\0') {
            return iVar3;
          }
          goto LAB_00103a8f;
        }
        uVar2 = aStack_96.file.open & 0xff3f;
        _local_98 = (mpt_fdmode)((ulong)_local_98 & 0xffffffffff3fffff);
        bVar1 = true;
      }
      iVar3 = open(where + uVar8,(uint)uVar2,(ulong)_local_98 >> 0x20 & 0xffff);
      if (iVar3 < 0) {
        if (bVar1) {
          unlink(where);
          return iVar3;
        }
        return iVar3;
      }
      _local_98 = (mpt_fdmode)((ulong)_local_98 & 0xffffffff);
      goto LAB_00103b07;
    }
  }
  iVar3 = socketSet(where + uVar8,(mpt_fdmode *)local_98,bind);
  if (iVar3 < 0) {
    return iVar3;
  }
  if (((-1 < backlog) && (uStack_92 == 7)) && (iVar4 = listen(iVar3,backlog), iVar4 < 0)) {
    close(iVar3);
    return -1;
  }
LAB_00103b07:
  if (-1 < sd->_id) {
    close(sd->_id);
  }
  sd->_id = iVar3;
  return (uint)aStack_96.file.perm;
}

Assistant:

extern int mpt_bind(MPT_STRUCT(socket) *sd, const char *where, const MPT_STRUCT(fdmode) *mode, int backlog)
{
	MPT_STRUCT(fdmode) info;
	int sock;
	
	if (!where) {
		if ((sock = sd->_id) < 0) {
			return 0;
		}
		(void) socketUnbind(sock);
		(void) close(sock);
		sd->_id = -1;
		return 1;
	}
	/* use mode passed by caller */
	if (mode) {
		info = *mode;
		sock = 0;
	}
	/* detect mode based on prefix */
	else if ((sock = mpt_mode_parse(&info, where)) < 0) {
		errno = EINVAL;
		return -1;
	}
	/* no prefix detected: default to IP socket */
	else if (!sock) {
		info.family = AF_UNSPEC;
		info.param.sock.type = SOCK_STREAM;
		info.param.sock.proto = 0;
		info.param.sock.port = 0;
	}
	/* open as normal file */
	if (info.family < 0) {
		int res = -1;
		if (info.param.file.open & O_WRONLY) {
			errno = EINVAL;
			return -1;
		}
		if (info.param.file.open & O_CREAT) {
			if ((res = mkfifo(where, info.param.file.perm)) >= 0) {
				info.param.file.open &= ~(O_EXCL | O_CREAT);
			}
			else if (info.param.file.open & O_EXCL) {
				return res;
			}
		}
		if ((sock = open(where + sock, info.param.file.open, info.param.file.perm)) < 0) {
			if (res >= 0) {
				unlink(where);
			}
			return sock;
		}
		info.stream = 0;
		info.param.sock.port = 0;
	}
	/* bind socket to address */
	else if ((sock = socketSet(where + sock, &info, bind)) < 0) {
		return sock;
	}
	/* require listening state */
	else if ((info.stream == (MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write) | MPT_SOCKETFLAG(Stream)))
	    && (backlog >= 0)
	    && listen(sock, backlog) < 0) {
		(void) close(sock);
		return -1;
	}
	if (sd->_id >= 0) {
		(void) close(sd->_id);
	}
	sd->_id = sock;
	
	return info.param.sock.port;
}